

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
embree::ImageT<embree::Col4<unsigned_char>_>::ImageT
          (ImageT<embree::Col4<unsigned_char>_> *this,size_t width,size_t height,
          Col4<unsigned_char> *color,bool copy,string *name,bool flip_y)

{
  size_t i;
  Col4<unsigned_char> *pCVar1;
  long lVar2;
  Col4<unsigned_char> *pCVar3;
  size_t sVar4;
  undefined7 in_register_00000081;
  size_t sVar5;
  ulong uVar6;
  
  Image::Image(&this->super_Image,width,height,name);
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__ImageT_002a6b70;
  if ((int)CONCAT71(in_register_00000081,copy) == 0) {
    this->data = color;
  }
  else {
    uVar6 = height * width;
    pCVar1 = (Col4<unsigned_char> *)operator_new__(-(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4);
    this->data = pCVar1;
    if (flip_y) {
      pCVar3 = color + (height - 1) * width;
      for (sVar4 = 0; sVar4 != height; sVar4 = sVar4 + 1) {
        for (sVar5 = 0; width != sVar5; sVar5 = sVar5 + 1) {
          pCVar1[sVar5] = pCVar3[sVar5];
        }
        pCVar3 = pCVar3 + -width;
        pCVar1 = pCVar1 + width;
      }
    }
    else {
      for (lVar2 = 0; uVar6 - lVar2 != 0; lVar2 = lVar2 + 1) {
        pCVar1 = this->data;
        pCVar1[lVar2].r = color[lVar2].r;
        pCVar1[lVar2].g = color[lVar2].g;
        pCVar1[lVar2].b = color[lVar2].b;
        pCVar1[lVar2].a = color[lVar2].a;
      }
    }
  }
  return;
}

Assistant:

ImageT (size_t width, size_t height, T* color, const bool copy = true, const std::string& name = "", const bool flip_y = false)
      : Image(width,height,name)
    {
      if (copy)
      {
        data = new T[width*height];

        if (flip_y)
        {
          const T* in = color + (height-1) * width;
          T* out = data;

          for (size_t y=0; y<height; y++)
          {
            for (size_t x=0; x<width; x++)
              out[x] = in[x];

            in -= width;
            out += width;
          }
        }
        else
        {
          for (size_t i=0; i<width*height; i++)
            data[i] = color[i];
        }
      } 
      else
      {
        data = color;
      }
    }